

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.cpp
# Opt level: O3

void TwoBytesKeygen(int maxlen,KeyCallback *c)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int valA;
  ulong uVar6;
  int byteA;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  uint8_t key [256];
  long local_158;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar9 = 0;
  if (1 < maxlen) {
    iVar4 = 2;
    iVar5 = 0;
    do {
      dVar10 = chooseK(iVar4,2);
      iVar1 = (1 - maxlen) + iVar4;
      iVar4 = iVar4 + 1;
      iVar5 = iVar5 + (int)dVar10;
    } while (iVar1 != 1);
    uVar9 = iVar5 * 0xfe01;
    if (1 < maxlen) {
      uVar9 = (int)((ulong)(maxlen - 3) * (ulong)(maxlen - 2) >> 1) * 0xff + -0x3fc +
              uVar9 + maxlen * 0x2fd;
      printf("Keyset \'TwoBytes\' - up-to-%d-byte keys, %d total keys\n",(ulong)(uint)maxlen,
             (ulong)uVar9);
      (*c->_vptr_KeyCallback[3])(c,(ulong)uVar9);
      uVar6 = 2;
      local_78 = 0;
      uStack_70 = 0;
      uStack_68 = 0;
      uStack_60 = 0;
      uStack_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      uStack_a8 = 0;
      uStack_a0 = 0;
      uStack_98 = 0;
      uStack_90 = 0;
      uStack_88 = 0;
      uStack_80 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      uStack_e8 = 0;
      uStack_e0 = 0;
      uStack_d8 = 0;
      uStack_d0 = 0;
      uStack_c8 = 0;
      uStack_c0 = 0;
      local_138 = 0;
      uStack_130 = 0;
      uStack_128 = 0;
      uStack_120 = 0;
      uStack_118 = 0;
      uStack_110 = 0;
      uStack_108 = 0;
      uStack_100 = 0;
      do {
        uVar7 = 0;
        do {
          iVar4 = -0xff;
          do {
            *(char *)((long)&local_138 + uVar7) = (char)iVar4;
            (*c->_vptr_KeyCallback[2])(c,&local_138,uVar6 & 0xffffffff);
            iVar4 = iVar4 + 1;
          } while (iVar4 != 0);
          *(undefined1 *)((long)&local_138 + uVar7) = 0;
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar6);
        uVar6 = uVar6 + 1;
      } while (uVar6 != maxlen + 1);
      if (maxlen < 2) {
        return;
      }
      uVar6 = 2;
      local_158 = 1;
      do {
        uVar7 = 1;
        lVar2 = 0;
        do {
          lVar3 = lVar2 + 1;
          uVar8 = uVar7;
          do {
            iVar4 = 1;
            do {
              iVar5 = -0xff;
              *(char *)((long)&local_138 + lVar2) = (char)iVar4;
              do {
                *(char *)((long)&local_138 + uVar8) = (char)iVar5;
                (*c->_vptr_KeyCallback[2])(c,&local_138,uVar6 & 0xffffffff);
                iVar5 = iVar5 + 1;
              } while (iVar5 != 0);
              iVar4 = iVar4 + 1;
              *(undefined1 *)((long)&local_138 + uVar8) = 0;
            } while (iVar4 != 0x100);
            uVar8 = uVar8 + 1;
            *(undefined1 *)((long)&local_138 + lVar2) = 0;
          } while (uVar8 != uVar6);
          uVar7 = uVar7 + 1;
          lVar2 = lVar3;
        } while (lVar3 != local_158);
        local_158 = local_158 + 1;
        uVar6 = uVar6 + 1;
      } while (uVar6 != maxlen + 1);
      return;
    }
  }
  printf("Keyset \'TwoBytes\' - up-to-%d-byte keys, %d total keys\n",(ulong)(uint)maxlen,
         (ulong)uVar9);
  (*c->_vptr_KeyCallback[3])(c,(ulong)uVar9);
  return;
}

Assistant:

void TwoBytesKeygen ( int maxlen, KeyCallback & c )
{
  //----------
  // Compute # of keys

  int keycount = 0;

  for(int i = 2; i <= maxlen; i++) keycount += (int)chooseK(i,2);

  keycount *= 255*255;

  for(int i = 2; i <= maxlen; i++) keycount += i*255;

  printf("Keyset 'TwoBytes' - up-to-%d-byte keys, %d total keys\n", maxlen, keycount);

  c.reserve(keycount);

  //----------
  // Add all keys with one non-zero byte

  uint8_t key[256];

  memset(key,0,256);

  for(int keylen = 2; keylen <= maxlen; keylen++)
  for(int byteA = 0; byteA < keylen; byteA++)
  {
    for(int valA = 1; valA <= 255; valA++)
    {
      key[byteA] = (uint8_t)valA;

      c(key,keylen);
    }

    key[byteA] = 0;
  }

  //----------
  // Add all keys with two non-zero bytes

  for(int keylen = 2; keylen <= maxlen; keylen++)
  for(int byteA = 0; byteA < keylen-1; byteA++)
  for(int byteB = byteA+1; byteB < keylen; byteB++)
  {
    for(int valA = 1; valA <= 255; valA++)
    {
      key[byteA] = (uint8_t)valA;

      for(int valB = 1; valB <= 255; valB++)
      {
        key[byteB] = (uint8_t)valB;
        c(key,keylen);
      }

      key[byteB] = 0;
    }

    key[byteA] = 0;
  }
}